

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O2

ValueType __thiscall ValueType::Merge(ValueType *this,Var var)

{
  ValueType valueType;
  code *pcVar1;
  bool bVar2;
  Type bits;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar3;
  undefined8 in_RAX;
  undefined4 *puVar4;
  RecyclableObject *recyclableObject;
  anon_union_2_4_ea848c7b_for_ValueType_13 *this_00;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_26;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_24;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_22 [3];
  ValueType merged;
  ValueType merged_1;
  
  local_26.bits = (Type)((ulong)in_RAX >> 0x10);
  if (var == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x44d,"(var)","var");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar2 = Js::TaggedInt::Is(var);
  if (bVar2) {
    Verify(*(ValueType *)&(this->field_0).field_0);
    if ((this->field_0).bits == (Int|CanBeTaggedValue)) {
      return (ValueType)(anon_union_2_4_ea848c7b_for_ValueType_13)0x28;
    }
    ValueType((ValueType *)&local_26.field_0,(this->field_0).bits | (Int|CanBeTaggedValue));
    if ((local_26.bits & Object) == 0) {
      Verify((ValueType)local_26.field_0);
      return (ValueType)local_26;
    }
    aVar3.bits = Int|CanBeTaggedValue;
  }
  else {
    if ((ulong)var >> 0x32 == 0) {
      recyclableObject = Js::UnsafeVarTo<Js::RecyclableObject>(var);
      aVar3.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           FromObject(recyclableObject);
      Verify(*(ValueType *)&(this->field_0).field_0);
      Verify((ValueType)aVar3.field_0);
      if ((this->field_0).bits == aVar3.bits) {
        return (ValueType)
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)aVar3;
      }
      bits = (this->field_0).bits | aVar3.bits;
      this_00 = local_22;
    }
    else {
      aVar3.bits = Float|CanBeTaggedValue;
      if ((((this->field_0).bits & ~CanBeTaggedValue) == Likely ||
           ((this->field_0).bits &
           ~(Number|IntIsLikelyUntagged|IntCanBeUntagged|CanBeTaggedValue|Likely)) == Int) &&
         (bVar2 = Js::JavascriptNumber::IsInt32_NoChecks(var), bVar2)) {
        aVar3.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             Verify(IntIsLikelyUntagged|IntCanBeUntagged|Int|CanBeTaggedValue);
      }
      Verify(*(ValueType *)&(this->field_0).field_0);
      Verify((ValueType)aVar3.field_0);
      if ((this->field_0).bits == aVar3.bits) {
        return (ValueType)aVar3.field_0;
      }
      bits = (this->field_0).bits | aVar3.bits;
      this_00 = &local_24;
    }
    ValueType((ValueType *)&this_00->field_0,bits);
    valueType.field_0 =
         (anon_union_2_4_ea848c7b_for_ValueType_13)
         *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&this_00->field_0;
    if (((ushort)valueType.field_0 & 0x10) == 0) {
      Verify(valueType);
      return (ValueType)
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             valueType.field_0;
    }
  }
  aVar3.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       MergeWithObject(this,aVar3.field_0);
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)aVar3.field_0;
}

Assistant:

ValueType ValueType::Merge(const Js::Var var) const
{
    using namespace Js;
    Assert(var);

    if(TaggedInt::Is(var))
        return Merge(GetTaggedInt());
    if(JavascriptNumber::Is_NoTaggedIntCheck(var))
    {
        return
            Merge(
                (IsUninitialized() || IsLikelyInt()) && JavascriptNumber::IsInt32_NoChecks(var)
                    ? GetInt(false)
                    : ValueType::Float);
    }
    return Merge(FromObject(UnsafeVarTo<RecyclableObject>(var)));
}